

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O2

void Test34(void)

{
  CMReturn In;
  CMReturn In_00;
  CMReturn In_01;
  CMReturn In_02;
  CMReturn In_03;
  CMOptions Options;
  CMOptions Options_00;
  CMOptions Options_01;
  CMOptions Options_02;
  CMOptions Options_03;
  CMOptions Options_04;
  CMOptions Options_05;
  allocator<char> local_248e;
  allocator<char> local_248d;
  _CM_RETURN_STATUS local_248c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2488;
  CMReturn res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2428;
  undefined7 local_2408;
  undefined1 uStack_2401;
  undefined7 uStack_2400;
  string local_23f8;
  string local_23d8;
  undefined8 local_23b8;
  undefined8 uStack_23b0;
  undefined8 local_23a8;
  undefined8 local_2398;
  undefined8 uStack_2390;
  undefined8 local_2388;
  undefined8 uStack_2380;
  undefined1 local_2378;
  undefined7 uStack_2377;
  undefined1 uStack_2370;
  undefined7 uStack_236f;
  undefined8 local_2368;
  undefined8 uStack_2360;
  undefined8 local_2358;
  undefined8 uStack_2350;
  undefined1 local_2348;
  undefined7 uStack_2347;
  undefined1 uStack_2340;
  undefined7 uStack_233f;
  undefined8 local_2338;
  undefined8 uStack_2330;
  undefined8 local_2328;
  undefined8 uStack_2320;
  undefined1 local_2318;
  undefined7 uStack_2317;
  undefined1 uStack_2310;
  undefined7 uStack_230f;
  undefined8 local_2308;
  undefined8 uStack_2300;
  undefined8 local_22f8;
  undefined8 uStack_22f0;
  undefined1 local_22e8;
  undefined7 uStack_22e7;
  undefined1 uStack_22e0;
  undefined7 uStack_22df;
  undefined8 local_22d8;
  undefined8 uStack_22d0;
  undefined8 local_22c8;
  undefined8 uStack_22c0;
  undefined1 local_22b8;
  undefined7 uStack_22b7;
  undefined1 uStack_22b0;
  undefined7 uStack_22af;
  undefined8 local_22a8;
  undefined8 uStack_22a0;
  undefined8 local_2298;
  undefined8 uStack_2290;
  undefined1 local_2288;
  undefined7 uStack_2287;
  undefined1 uStack_2280;
  undefined7 uStack_227f;
  undefined8 local_2278;
  undefined8 uStack_2270;
  undefined8 local_2268;
  undefined8 uStack_2260;
  undefined1 local_2258;
  undefined7 uStack_2257;
  undefined1 uStack_2250;
  undefined7 uStack_224f;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2240;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  string local_2208;
  string local_21e8;
  string local_21c8;
  string local_21a8;
  string local_2188;
  string local_2168;
  string local_2148;
  string local_2128;
  string local_2108;
  string local_20e8;
  string local_20c8;
  string local_20a8;
  string local_2088;
  string local_2068;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2048;
  ConfusableMatcher matcher;
  
  map.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_23a8 = 0;
  map.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  map.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2408 = 0;
  local_23b8 = 0;
  uStack_23b0 = 0;
  uStack_2401 = 0;
  uStack_2400 = 0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2240,&map);
  local_2048._M_buckets = &local_2048._M_single_bucket;
  local_2048._M_bucket_count = 1;
  local_2048._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2048._M_element_count = 0;
  local_2048._M_rehash_policy._M_max_load_factor = 1.0;
  local_2048._M_rehash_policy._4_4_ = 0;
  local_2048._M_rehash_policy._M_next_resize = 0;
  local_2048._M_single_bucket = (__node_base_ptr)0x0;
  ConfusableMatcher::ConfusableMatcher
            (&matcher,&local_2240,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2048,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2048);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2068,"SUPER",(allocator<char> *)&local_2488);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2088,"SUPER",(allocator<char> *)&local_2448);
  local_2278 = 0;
  uStack_2270 = 0;
  local_2268 = 0;
  uStack_2260 = 1000000;
  local_2258 = 1;
  uStack_2257 = 0;
  uStack_2250 = 0;
  uStack_224f = 0;
  Options._16_8_ = 0;
  Options.MatchRepeating = false;
  Options._1_7_ = 0;
  Options.StartIndex = 0;
  Options.TimeoutNs = 1000000;
  Options._32_8_ = 1;
  Options.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf(&res,&matcher,&local_2068,&local_2088,Options);
  std::__cxx11::string::~string((string *)&local_2088);
  std::__cxx11::string::~string((string *)&local_2068);
  In.Size = res.Size;
  In.Start = res.Start;
  In.Status = res.Status;
  In._20_4_ = res._20_4_;
  AssertMatch(In,0,5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_20a8,"aSUPER",(allocator<char> *)&local_2448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_20c8,"SUPER",(allocator<char> *)&local_2428);
  local_22a8 = 0;
  uStack_22a0 = 0;
  local_2298 = 0;
  uStack_2290 = 1000000;
  local_2288 = 1;
  uStack_2287 = 0;
  uStack_2280 = 0;
  uStack_227f = 0;
  Options_00._16_8_ = 0;
  Options_00.MatchRepeating = false;
  Options_00._1_7_ = 0;
  Options_00.StartIndex = 0;
  Options_00.TimeoutNs = 1000000;
  Options_00._32_8_ = 1;
  Options_00.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf((CMReturn *)&local_2488,&matcher,&local_20a8,&local_20c8,Options_00);
  res._16_8_ = local_2488.field_2._M_allocated_capacity;
  res.Start = (uint64_t)local_2488._M_dataplus._M_p;
  res.Size = local_2488._M_string_length;
  std::__cxx11::string::~string((string *)&local_20c8);
  std::__cxx11::string::~string((string *)&local_20a8);
  local_248c = WORD_BOUNDARY_FAIL_START;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2428,"Test34",&local_248d);
  std::operator+(&local_2448,&local_2428,": ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_23f8,"WORD_BOUNDARY_FAIL_START == res.Status",&local_248e);
  cute::cute_to_string::backslashQuoteTabNewline(&local_23d8,&local_23f8);
  std::operator+(&local_2488,&local_2448,&local_23d8);
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_248c,&res.Status,&local_2488,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x33e);
  std::__cxx11::string::~string((string *)&local_2488);
  std::__cxx11::string::~string((string *)&local_23d8);
  std::__cxx11::string::~string((string *)&local_23f8);
  std::__cxx11::string::~string((string *)&local_2448);
  std::__cxx11::string::~string((string *)&local_2428);
  local_248c = NO_MATCH;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2428,"Test34",&local_248d);
  std::operator+(&local_2448,&local_2428,": ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_23f8,"1 == res.Start",&local_248e);
  cute::cute_to_string::backslashQuoteTabNewline(&local_23d8,&local_23f8);
  std::operator+(&local_2488,&local_2448,&local_23d8);
  cute::assert_equal<int,unsigned_long>
            ((int *)&local_248c,&res.Start,&local_2488,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x33f);
  std::__cxx11::string::~string((string *)&local_2488);
  std::__cxx11::string::~string((string *)&local_23d8);
  std::__cxx11::string::~string((string *)&local_23f8);
  std::__cxx11::string::~string((string *)&local_2448);
  std::__cxx11::string::~string((string *)&local_2428);
  local_248c = WORD_BOUNDARY_FAIL_END|NO_MATCH;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2428,"Test34",&local_248d);
  std::operator+(&local_2448,&local_2428,": ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_23f8,"5 == res.Size",&local_248e);
  cute::cute_to_string::backslashQuoteTabNewline(&local_23d8,&local_23f8);
  std::operator+(&local_2488,&local_2448,&local_23d8);
  cute::assert_equal<int,unsigned_long>
            ((int *)&local_248c,&res.Size,&local_2488,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x340);
  std::__cxx11::string::~string((string *)&local_2488);
  std::__cxx11::string::~string((string *)&local_23d8);
  std::__cxx11::string::~string((string *)&local_23f8);
  std::__cxx11::string::~string((string *)&local_2448);
  std::__cxx11::string::~string((string *)&local_2428);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_20e8,"SUPERa",(allocator<char> *)&local_2448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2108,"SUPER",(allocator<char> *)&local_2428);
  local_22c8 = local_23a8;
  local_22d8 = local_23b8;
  uStack_22d0 = uStack_23b0;
  uStack_22c0 = 1000000;
  local_22b8 = 1;
  uStack_22b7 = local_2408;
  uStack_22b0 = uStack_2401;
  uStack_22af = uStack_2400;
  Options_01._33_7_ = local_2408;
  Options_01.MatchOnWordBoundary = true;
  Options_01.ContainsPosPointers._1_7_ = uStack_2400;
  Options_01.ContainsPosPointers._0_1_ = uStack_2401;
  Options_01.StartIndex = uStack_23b0;
  Options_01._0_8_ = local_23b8;
  Options_01._16_8_ = local_23a8;
  Options_01.TimeoutNs = 1000000;
  ConfusableMatcher::IndexOf((CMReturn *)&local_2488,&matcher,&local_20e8,&local_2108,Options_01);
  res._16_8_ = local_2488.field_2._M_allocated_capacity;
  res.Start = (uint64_t)local_2488._M_dataplus._M_p;
  res.Size = local_2488._M_string_length;
  std::__cxx11::string::~string((string *)&local_2108);
  std::__cxx11::string::~string((string *)&local_20e8);
  local_248c = WORD_BOUNDARY_FAIL_END;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2428,"Test34",&local_248d);
  std::operator+(&local_2448,&local_2428,": ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_23f8,"WORD_BOUNDARY_FAIL_END == res.Status",&local_248e);
  cute::cute_to_string::backslashQuoteTabNewline(&local_23d8,&local_23f8);
  std::operator+(&local_2488,&local_2448,&local_23d8);
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_248c,&res.Status,&local_2488,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x343);
  std::__cxx11::string::~string((string *)&local_2488);
  std::__cxx11::string::~string((string *)&local_23d8);
  std::__cxx11::string::~string((string *)&local_23f8);
  std::__cxx11::string::~string((string *)&local_2448);
  std::__cxx11::string::~string((string *)&local_2428);
  local_248c = MATCH;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2428,"Test34",&local_248d);
  std::operator+(&local_2448,&local_2428,": ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_23f8,"0 == res.Start",&local_248e);
  cute::cute_to_string::backslashQuoteTabNewline(&local_23d8,&local_23f8);
  std::operator+(&local_2488,&local_2448,&local_23d8);
  cute::assert_equal<int,unsigned_long>
            ((int *)&local_248c,&res.Start,&local_2488,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x344);
  std::__cxx11::string::~string((string *)&local_2488);
  std::__cxx11::string::~string((string *)&local_23d8);
  std::__cxx11::string::~string((string *)&local_23f8);
  std::__cxx11::string::~string((string *)&local_2448);
  std::__cxx11::string::~string((string *)&local_2428);
  local_248c = WORD_BOUNDARY_FAIL_END|NO_MATCH;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2428,"Test34",&local_248d);
  std::operator+(&local_2448,&local_2428,": ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_23f8,"5 == res.Size",&local_248e);
  cute::cute_to_string::backslashQuoteTabNewline(&local_23d8,&local_23f8);
  std::operator+(&local_2488,&local_2448,&local_23d8);
  cute::assert_equal<int,unsigned_long>
            ((int *)&local_248c,&res.Size,&local_2488,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x345);
  std::__cxx11::string::~string((string *)&local_2488);
  std::__cxx11::string::~string((string *)&local_23d8);
  std::__cxx11::string::~string((string *)&local_23f8);
  std::__cxx11::string::~string((string *)&local_2448);
  std::__cxx11::string::~string((string *)&local_2428);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2128,"a SUPER",(allocator<char> *)&local_2448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2148,"SUPER",(allocator<char> *)&local_2428);
  local_22f8 = local_23a8;
  local_2308 = local_23b8;
  uStack_2300 = uStack_23b0;
  uStack_22f0 = 1000000;
  local_22e8 = 1;
  uStack_22e7 = local_2408;
  uStack_22e0 = uStack_2401;
  uStack_22df = uStack_2400;
  Options_02._33_7_ = local_2408;
  Options_02.MatchOnWordBoundary = true;
  Options_02.ContainsPosPointers._1_7_ = uStack_2400;
  Options_02.ContainsPosPointers._0_1_ = uStack_2401;
  Options_02.StartIndex = uStack_23b0;
  Options_02._0_8_ = local_23b8;
  Options_02._16_8_ = local_23a8;
  Options_02.TimeoutNs = 1000000;
  ConfusableMatcher::IndexOf((CMReturn *)&local_2488,&matcher,&local_2128,&local_2148,Options_02);
  res._16_8_ = local_2488.field_2._M_allocated_capacity;
  res.Start = (uint64_t)local_2488._M_dataplus._M_p;
  res.Size = local_2488._M_string_length;
  std::__cxx11::string::~string((string *)&local_2148);
  std::__cxx11::string::~string((string *)&local_2128);
  In_00.Size = res.Size;
  In_00.Start = res.Start;
  In_00.Status = res.Status;
  In_00._20_4_ = res._20_4_;
  AssertMatch(In_00,2,5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2168,"SUPER a",(allocator<char> *)&local_2448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2188,"SUPER",(allocator<char> *)&local_2428);
  local_2328 = local_23a8;
  local_2338 = local_23b8;
  uStack_2330 = uStack_23b0;
  uStack_2320 = 1000000;
  local_2318 = 1;
  uStack_2317 = local_2408;
  uStack_2310 = uStack_2401;
  uStack_230f = uStack_2400;
  Options_03._33_7_ = local_2408;
  Options_03.MatchOnWordBoundary = true;
  Options_03.ContainsPosPointers._1_7_ = uStack_2400;
  Options_03.ContainsPosPointers._0_1_ = uStack_2401;
  Options_03.StartIndex = uStack_23b0;
  Options_03._0_8_ = local_23b8;
  Options_03._16_8_ = local_23a8;
  Options_03.TimeoutNs = 1000000;
  ConfusableMatcher::IndexOf((CMReturn *)&local_2488,&matcher,&local_2168,&local_2188,Options_03);
  res._16_8_ = local_2488.field_2._M_allocated_capacity;
  res.Start = (uint64_t)local_2488._M_dataplus._M_p;
  res.Size = local_2488._M_string_length;
  std::__cxx11::string::~string((string *)&local_2188);
  std::__cxx11::string::~string((string *)&local_2168);
  In_01.Size = res.Size;
  In_01.Start = res.Start;
  In_01.Status = res.Status;
  In_01._20_4_ = res._20_4_;
  AssertMatch(In_01,0,5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_21a8,"SUPER;duper",(allocator<char> *)&local_2448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_21c8,"SUPER",(allocator<char> *)&local_2428);
  local_2358 = local_23a8;
  local_2368 = local_23b8;
  uStack_2360 = uStack_23b0;
  uStack_2350 = 1000000;
  local_2348 = 1;
  uStack_2347 = local_2408;
  uStack_2340 = uStack_2401;
  uStack_233f = uStack_2400;
  Options_04._33_7_ = local_2408;
  Options_04.MatchOnWordBoundary = true;
  Options_04.ContainsPosPointers._1_7_ = uStack_2400;
  Options_04.ContainsPosPointers._0_1_ = uStack_2401;
  Options_04.StartIndex = uStack_23b0;
  Options_04._0_8_ = local_23b8;
  Options_04._16_8_ = local_23a8;
  Options_04.TimeoutNs = 1000000;
  ConfusableMatcher::IndexOf((CMReturn *)&local_2488,&matcher,&local_21a8,&local_21c8,Options_04);
  res._16_8_ = local_2488.field_2._M_allocated_capacity;
  res.Start = (uint64_t)local_2488._M_dataplus._M_p;
  res.Size = local_2488._M_string_length;
  std::__cxx11::string::~string((string *)&local_21c8);
  std::__cxx11::string::~string((string *)&local_21a8);
  In_02.Size = res.Size;
  In_02.Start = res.Start;
  In_02.Status = res.Status;
  In_02._20_4_ = res._20_4_;
  AssertMatch(In_02,0,5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_21e8,anon_var_dwarf_16b92 + 3,(allocator<char> *)&local_2448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2208,"SUPER",(allocator<char> *)&local_2428);
  local_2388 = local_23a8;
  local_2398 = local_23b8;
  uStack_2390 = uStack_23b0;
  uStack_2380 = 1000000;
  local_2378 = 1;
  uStack_2377 = local_2408;
  uStack_2370 = uStack_2401;
  uStack_236f = uStack_2400;
  Options_05._33_7_ = local_2408;
  Options_05.MatchOnWordBoundary = true;
  Options_05.ContainsPosPointers._1_7_ = uStack_2400;
  Options_05.ContainsPosPointers._0_1_ = uStack_2401;
  Options_05.StartIndex = uStack_23b0;
  Options_05._0_8_ = local_23b8;
  Options_05._16_8_ = local_23a8;
  Options_05.TimeoutNs = 1000000;
  ConfusableMatcher::IndexOf((CMReturn *)&local_2488,&matcher,&local_21e8,&local_2208,Options_05);
  res._16_8_ = local_2488.field_2._M_allocated_capacity;
  res.Start = (uint64_t)local_2488._M_dataplus._M_p;
  res.Size = local_2488._M_string_length;
  std::__cxx11::string::~string((string *)&local_2208);
  std::__cxx11::string::~string((string *)&local_21e8);
  In_03.Size = res.Size;
  In_03.Start = res.Start;
  In_03.Status = res.Status;
  In_03._20_4_ = res._20_4_;
  AssertMatch(In_03,6,5);
  ConfusableMatcher::~ConfusableMatcher(&matcher);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&map);
  return;
}

Assistant:

void Test34()
{
	std::vector<std::pair<std::string, std::string>> map;

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchOnWordBoundary = true;

	auto matcher = ConfusableMatcher(map, {});
	auto res = matcher.IndexOf("SUPER", "SUPER", opts);
	AssertMatch(res, 0, 5);

	res = matcher.IndexOf("aSUPER", "SUPER", opts);
	ASSERT_EQUAL(WORD_BOUNDARY_FAIL_START, res.Status);
	ASSERT_EQUAL(1, res.Start);
	ASSERT_EQUAL(5, res.Size);

	res = matcher.IndexOf("SUPERa", "SUPER", opts);
	ASSERT_EQUAL(WORD_BOUNDARY_FAIL_END, res.Status);
	ASSERT_EQUAL(0, res.Start);
	ASSERT_EQUAL(5, res.Size);

	res = matcher.IndexOf("a SUPER", "SUPER", opts);
	AssertMatch(res, 2, 5);

	res = matcher.IndexOf("SUPER a", "SUPER", opts);
	AssertMatch(res, 0, 5);

	res = matcher.IndexOf("SUPER;duper", "SUPER", opts);
	AssertMatch(res, 0, 5);

	res = matcher.IndexOf("yes\u202FSUPER", "SUPER", opts);
	AssertMatch(res, 6, 5);
}